

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

CaseProd *
slang::ast::RandSeqProductionSymbol::createCaseProd(RsCaseSyntax *syntax,ASTContext *context)

{
  size_type sVar1;
  SyntaxNode *this;
  RsProdItemSyntax *pRVar2;
  Scope *pSVar3;
  Expression *args;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  int iVar4;
  StandardRsCaseItemSyntax *pSVar5;
  DefaultRsCaseItemSyntax *pDVar6;
  ProdItem *pPVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CaseProd *pCVar8;
  logic_error *this_00;
  long *plVar9;
  pointer pCVar10;
  ExpressionSyntax *pEVar11;
  pointer pCVar12;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *pEVar13;
  EVP_PKEY_CTX *extraout_RDX_02;
  pointer ppRVar14;
  SyntaxKind *args_00;
  ulong uVar15;
  pointer ppRVar16;
  size_t index;
  pointer pPVar17;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  SmallVector<const_slang::ast::Expression_*,_5UL> group;
  optional<slang::ast::RandSeqProductionSymbol::ProdItem> defItem;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL> items;
  SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL> prods;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffb98;
  Compilation *this_01;
  undefined1 local_448 [16];
  undefined1 local_438 [24];
  RandSeqProductionSymbol *pRStack_420;
  ExpressionSyntax *local_418;
  size_type local_410;
  undefined1 local_408 [8];
  ExpressionSyntax aEStack_400 [2];
  undefined1 *local_3d8 [2];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [24];
  Expression *local_3a0 [5];
  _Storage<slang::ast::RandSeqProductionSymbol::ProdItem,_true> local_378;
  undefined1 local_358;
  ExpressionSyntax *local_350;
  pointer ppEStack_348;
  string local_340;
  ExpressionSyntax *local_320;
  pointer ppEStack_318;
  undefined8 local_310;
  ExpressionSyntax local_308 [2];
  undefined1 local_2e0 [24];
  CaseItem aCStack_2c8 [8];
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> local_148 [5];
  
  local_320 = local_308;
  ppEStack_318 = (pointer)0x0;
  local_310 = 5;
  local_148[0].data_ = (pointer)local_148[0].firstElement;
  local_148[0].len = 0;
  local_148[0].cap = 8;
  local_358 = 0;
  sVar1 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.
          size_;
  if (sVar1 != 0) {
    ppRVar14 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>
               .data_;
    ppRVar16 = ppRVar14 + sVar1;
    in_stack_fffffffffffffb98 = (SmallVectorBase<const_slang::ast::Expression_*> *)0x0;
    do {
      this = &(*ppRVar14)->super_SyntaxNode;
      if (this->kind == DefaultRsCaseItem) {
        if (((ulong)in_stack_fffffffffffffb98 & 1) == 0) {
          pDVar6 = slang::syntax::SyntaxNode::as<slang::syntax::DefaultRsCaseItemSyntax>(this);
          pRVar2 = (pDVar6->item).ptr;
          if (pRVar2 == (RsProdItemSyntax *)0x0) {
            assert::assertFailed
                      ("ptr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                       ,0x26,
                       "T slang::not_null<slang::syntax::RsProdItemSyntax *>::get() const [T = slang::syntax::RsProdItemSyntax *]"
                      );
          }
          pPVar7 = createProdItem((ProdItem *)local_2e0,pRVar2,context);
          local_378._M_value.args.data_ = (pointer)local_2e0._16_8_;
          local_378._M_value.args.size_ = (size_type)aCStack_2c8[0].expressions.data_;
          local_378._0_8_ = local_2e0._0_8_;
          local_378._M_value.target = (RandSeqProductionSymbol *)local_2e0._8_8_;
          if (((ulong)in_stack_fffffffffffffb98 & 1) == 0) {
            local_358 = 1;
            in_stack_fffffffffffffb98 =
                 (SmallVectorBase<const_slang::ast::Expression_*> *)
                 CONCAT71((int7)((ulong)pPVar7 >> 8),1);
          }
        }
      }
      else {
        if (this->kind != StandardRsCaseItem) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          local_3d8[0] = local_3c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3d8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                     ,"");
          plVar9 = (long *)std::__cxx11::string::append((char *)local_3d8);
          local_448._0_8_ = *plVar9;
          pCVar10 = (pointer)(plVar9 + 2);
          if ((pointer)local_448._0_8_ == pCVar10) {
            local_438._0_8_ = (pCVar10->expressions).data_;
            local_438._8_8_ = plVar9[3];
            local_448._0_8_ = (pointer)local_438;
          }
          else {
            local_438._0_8_ = (pCVar10->expressions).data_;
          }
          local_448._8_8_ = plVar9[1];
          *plVar9 = (long)pCVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::to_string(&local_340,0x589);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_448,&local_340);
          plVar9 = (long *)std::__cxx11::string::append(local_3b8);
          local_418 = (ExpressionSyntax *)*plVar9;
          pEVar11 = (ExpressionSyntax *)(plVar9 + 2);
          if (local_418 == pEVar11) {
            local_408 = (undefined1  [8])(pEVar11->super_SyntaxNode).parent;
            aEStack_400[0].super_SyntaxNode.parent = (SyntaxNode *)plVar9[3];
            local_418 = (ExpressionSyntax *)local_408;
          }
          else {
            local_408 = (undefined1  [8])(pEVar11->super_SyntaxNode).parent;
          }
          local_410 = plVar9[1];
          *plVar9 = (long)pEVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_418);
          local_2e0._0_8_ = *plVar9;
          pCVar12 = (pointer)(plVar9 + 2);
          if ((pointer)local_2e0._0_8_ == pCVar12) {
            local_2e0._16_8_ = (pCVar12->expressions).data_;
            aCStack_2c8[0].expressions.data_ = (pointer)plVar9[3];
            local_2e0._0_8_ = (pointer)(local_2e0 + 0x10);
          }
          else {
            local_2e0._16_8_ = (pCVar12->expressions).data_;
          }
          local_2e0._8_8_ = plVar9[1];
          *plVar9 = (long)pCVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::logic_error::logic_error(this_00,(string *)local_2e0);
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        pSVar5 = slang::syntax::SyntaxNode::as<slang::syntax::StandardRsCaseItemSyntax>(this);
        pRVar2 = (pSVar5->item).ptr;
        if (pRVar2 == (RsProdItemSyntax *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<slang::syntax::RsProdItemSyntax *>::get() const [T = slang::syntax::RsProdItemSyntax *]"
                    );
        }
        createProdItem((ProdItem *)local_2e0,pRVar2,context);
        uVar15 = (pSVar5->expressions).elements.size_ + 1;
        if (1 < uVar15) {
          index = 0;
          do {
            local_418 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                        operator[](&pSVar5->expressions,index);
            SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
            emplace_back<slang::syntax::ExpressionSyntax_const*const&>
                      ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&local_320,
                       &local_418);
            SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::
            emplace_back<slang::ast::RandSeqProductionSymbol::ProdItem_const&>
                      (local_148,(ProdItem *)local_2e0);
            index = index + 1;
          } while (uVar15 >> 1 != index);
        }
      }
      ppRVar14 = ppRVar14 + 1;
    } while (ppRVar14 != ppRVar16);
  }
  local_418 = aEStack_400;
  local_410 = 0;
  local_408 = (undefined1  [8])0x5;
  pEVar11 = (syntax->expr).ptr;
  if (pEVar11 == (ExpressionSyntax *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
              );
  }
  local_350 = local_320;
  ppEStack_348 = ppEStack_318;
  expressions_00.size_ = (size_type)&local_418;
  expressions_00.data_ = ppEStack_318;
  Expression::bindMembershipExpressions
            ((Expression *)context,(ASTContext *)0x74,Unknown,false,true,true,SUB81(pEVar11,0),
             local_320,expressions_00,in_stack_fffffffffffffb98);
  local_2e0._0_8_ = aCStack_2c8;
  local_2e0._8_8_ = (RandSeqProductionSymbol *)0x0;
  local_2e0._16_8_ = (pointer)0x8;
  local_3b8._0_8_ = local_3a0;
  local_3b8._8_8_ = 0;
  local_3b8._16_8_ = 5;
  pSVar3 = (context->scope).ptr;
  if (pSVar3 == (Scope *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
              );
  }
  this_01 = pSVar3->compilation;
  args = (Expression *)(local_418->super_SyntaxNode).parent;
  sVar1 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.
          size_;
  pEVar13 = extraout_RDX;
  if (sVar1 != 0) {
    ppRVar16 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>
               .data_;
    ppRVar14 = ppRVar16 + sVar1;
    args_00 = &(local_418->super_SyntaxNode).kind;
    pPVar17 = local_148[0].data_;
    do {
      local_3b8._8_8_ = 0;
      if (((*ppRVar16)->super_SyntaxNode).kind == StandardRsCaseItem) {
        pSVar5 = slang::syntax::SyntaxNode::as<slang::syntax::StandardRsCaseItemSyntax>
                           (&(*ppRVar16)->super_SyntaxNode);
        pEVar13 = extraout_RDX_00;
        if (1 < (pSVar5->expressions).elements.size_ + 1) {
          uVar15 = 0;
          do {
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*const&>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)local_3b8,
                       (Expression **)args_00);
            args_00 = args_00 + 2;
            uVar15 = uVar15 + 1;
            pEVar13 = extraout_RDX_01;
          } while (uVar15 < (pSVar5->expressions).elements.size_ + 1 >> 1);
        }
        iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                          ((SmallVectorBase<const_slang::ast::Expression_*> *)local_3b8,
                           (EVP_PKEY_CTX *)this_01,pEVar13);
        local_448._0_8_ = CONCAT44(extraout_var,iVar4);
        local_438._0_8_ = *(undefined8 *)pPVar17;
        local_438._8_8_ = pPVar17->target;
        local_438._16_8_ = (pPVar17->args).data_;
        pRStack_420 = (RandSeqProductionSymbol *)(pPVar17->args).size_;
        SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::
        emplace_back<slang::ast::RandSeqProductionSymbol::CaseItem>
                  ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *)local_2e0,
                   (CaseItem *)local_448);
        pPVar17 = pPVar17 + 1;
        pEVar13 = extraout_RDX_02;
      }
      ppRVar16 = ppRVar16 + 1;
    } while (ppRVar16 != ppRVar14);
  }
  local_3b8._8_8_ = 0;
  iVar4 = SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::copy
                    ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *)local_2e0,
                     (EVP_PKEY_CTX *)this_01,pEVar13);
  local_448._0_8_ = CONCAT44(extraout_var_00,iVar4);
  pCVar8 = BumpAllocator::
           emplace<slang::ast::RandSeqProductionSymbol::CaseProd,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::RandSeqProductionSymbol::CaseItem,18446744073709551615ul>,std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>&>
                     (&this_01->super_BumpAllocator,args,
                      (span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> *
                      )local_448,
                      (optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)&local_378._M_value
                     );
  if ((Expression **)local_3b8._0_8_ != local_3a0) {
    free((void *)local_3b8._0_8_);
  }
  if ((CaseItem *)local_2e0._0_8_ != aCStack_2c8) {
    free((void *)local_2e0._0_8_);
  }
  if (local_418 != aEStack_400) {
    free(local_418);
  }
  if (local_148[0].data_ != (pointer)local_148[0].firstElement) {
    free(local_148[0].data_);
  }
  if (local_320 != local_308) {
    free(local_320);
  }
  return pCVar8;
}

Assistant:

const RandSeqProductionSymbol::CaseProd& RandSeqProductionSymbol::createCaseProd(
    const RsCaseSyntax& syntax, const ASTContext& context) {

    SmallVector<const ExpressionSyntax*> expressions;
    SmallVector<ProdItem, 8> prods;
    std::optional<ProdItem> defItem;

    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardRsCaseItem: {
                auto& sci = item->as<StandardRsCaseItemSyntax>();
                auto pi = createProdItem(*sci.item, context);
                for (auto es : sci.expressions) {
                    expressions.push_back(es);
                    prods.push_back(pi);
                }
                break;
            }
            case SyntaxKind::DefaultRsCaseItem:
                // The parser already errored for duplicate defaults,
                // so just ignore if it happens here.
                if (!defItem)
                    defItem = createProdItem(*item->as<DefaultRsCaseItemSyntax>().item, context);
                break;
            default:
                ASSUME_UNREACHABLE;
        }
    }

    SmallVector<const Expression*> bound;
    Expression::bindMembershipExpressions(context, TokenKind::CaseKeyword,
                                          /* requireIntegral */ false,
                                          /* unwrapUnpacked */ false,
                                          /* allowTypeReferences */ true, /* allowOpenRange */ true,
                                          *syntax.expr, expressions, bound);

    SmallVector<CaseItem, 8> items;
    SmallVector<const Expression*> group;
    auto& comp = context.getCompilation();
    auto boundIt = bound.begin();
    auto prodIt = prods.begin();
    auto expr = *boundIt++;

    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardRsCaseItem: {
                auto& sci = item->as<StandardRsCaseItemSyntax>();
                for (size_t i = 0; i < sci.expressions.size(); i++)
                    group.push_back(*boundIt++);

                items.push_back({group.copy(comp), *prodIt++});
                group.clear();
                break;
            }
            default:
                break;
        }
    }

    return *comp.emplace<CaseProd>(*expr, items.copy(comp), defItem);
}